

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voxels.cpp
# Opt level: O0

void __thiscall FVoxel::Remap(FVoxel *this)

{
  BYTE *remap_00;
  int local_1c;
  int i;
  BYTE *remap;
  FVoxel *this_local;
  
  if (this->Palette != (BYTE *)0x0) {
    remap_00 = GetVoxelRemap(this->Palette);
    for (local_1c = 0; local_1c < this->NumMips; local_1c = local_1c + 1) {
      RemapVoxelSlabs((kvxslab_t *)this->Mips[local_1c].SlabData,
                      this->Mips[local_1c].OffsetX[this->Mips[local_1c].SizeX],remap_00);
    }
    RemovePalette(this);
  }
  return;
}

Assistant:

void FVoxel::Remap()
{
	if (Palette != NULL)
	{
		BYTE *remap = GetVoxelRemap(Palette);
		for (int i = 0; i < NumMips; ++i)
		{
			RemapVoxelSlabs((kvxslab_t *)Mips[i].SlabData, Mips[i].OffsetX[Mips[i].SizeX], remap);
		}
		RemovePalette();
	}
}